

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O0

FFSRecordType next_record_type(FFSFile ffsfile)

{
  undefined8 uVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  FFSBuffer p_Var5;
  FFSTypeHandle_conflict p_Var6;
  int *piVar7;
  undefined4 uVar8;
  long in_RDI;
  int more_2;
  size_t more_1;
  _FFSIndexElement *elem;
  int i;
  int done;
  size_t tmp_data_len;
  char tmp_fid_storage [64];
  int fid_len;
  off_t fpos_bak;
  _FFSIndexItem *index;
  int more;
  long top_data_len_bytes;
  int header_size;
  char *tmp_buf;
  int indicator_chunk;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  FFSFile in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  FFSFile in_stack_ffffffffffffff48;
  int local_a8;
  int local_a4;
  undefined1 local_98 [76];
  int local_4c;
  size_t local_48;
  long local_40;
  int local_34;
  long local_30;
  int local_24;
  void *local_20;
  undefined4 local_14;
  long local_10;
  
  local_14 = 0;
  local_10 = in_RDI;
LAB_00121f5a:
  if (*(int *)(local_10 + 0xb0) != 0) {
    return FFSerror;
  }
  if (*(long *)(local_10 + 0x18) == 0) {
    p_Var5 = create_FFSBuffer();
    *(FFSBuffer *)(local_10 + 0x18) = p_Var5;
  }
  if (*(int *)(local_10 + 0x48) != 0) goto LAB_00122829;
  iVar2 = get_AtomicInt(in_stack_ffffffffffffff38,
                        (int *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  if (iVar2 == 0) {
    uVar8 = 2;
    if (*(int *)(local_10 + 0x4c) != 0) {
      uVar8 = 1;
    }
    *(undefined4 *)(local_10 + 0x54) = uVar8;
    return *(FFSRecordType *)(local_10 + 0x54);
  }
  uVar3 = ntohl(local_14);
  local_14._3_1_ = (char)(uVar3 >> 0x18);
  in_stack_ffffffffffffff38 = (FFSFile)(ulong)((int)local_14._3_1_ - 1);
  local_14 = uVar3;
  switch(in_stack_ffffffffffffff38) {
  case (FFSFile)0x0:
    *(undefined4 *)(local_10 + 0x54) = 0x10;
    *(long *)(local_10 + 0x38) = (long)(int)(uVar3 & 0xffffff);
    break;
  case (FFSFile)0x1:
    *(undefined4 *)(local_10 + 0x54) = 8;
    *(uint32_t *)(local_10 + 0x34) = uVar3 & 0xffffff;
    iVar2 = get_AtomicInt(in_stack_ffffffffffffff38,
                          (int *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    if (iVar2 == 0) {
      uVar8 = 2;
      if (*(int *)(local_10 + 0x4c) != 0) {
        uVar8 = 1;
      }
      *(undefined4 *)(local_10 + 0x54) = uVar8;
      return *(FFSRecordType *)(local_10 + 0x54);
    }
    uVar3 = ntohl(local_14);
    *(ulong *)(local_10 + 0x38) = (ulong)uVar3;
    break;
  case (FFSFile)0x2:
    *(undefined4 *)(local_10 + 0x54) = 4;
    local_30 = (long)(int)(uVar3 & 0xffff);
    iVar2 = get_AtomicInt(in_stack_ffffffffffffff38,
                          (int *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    if (iVar2 == 0) {
      uVar8 = 2;
      if (*(int *)(local_10 + 0x4c) != 0) {
        uVar8 = 1;
      }
      *(undefined4 *)(local_10 + 0x54) = uVar8;
      return *(FFSRecordType *)(local_10 + 0x54);
    }
    uVar3 = ntohl(local_14);
    *(ulong *)(local_10 + 0x38) = (ulong)uVar3 + (local_30 << 0x20);
    make_tmp_buffer((FFSBuffer)in_stack_ffffffffffffff38,
                    CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    local_20 = (void *)**(undefined8 **)(local_10 + 0x18);
    iVar2 = (**(code **)(local_10 + 0xc0))(*(undefined8 *)(local_10 + 0x20),local_20,8,0);
    if (iVar2 != 8) {
      uVar8 = 2;
      if (*(int *)(local_10 + 0x4c) != 0) {
        uVar8 = 1;
      }
      *(undefined4 *)(local_10 + 0x54) = uVar8;
      return *(FFSRecordType *)(local_10 + 0x54);
    }
    iVar2 = FMformatID_len((char *)0x122275);
    *(int *)(local_10 + 0x34) = iVar2;
    if (8 < *(int *)(local_10 + 0x34)) {
      local_34 = *(int *)(local_10 + 0x34) + -8;
      iVar2 = (**(code **)(local_10 + 0xc0))
                        (*(undefined8 *)(local_10 + 0x20),(long)local_20 + 8,(long)local_34,0);
      if (iVar2 != local_34) {
        uVar8 = 2;
        if (*(int *)(local_10 + 0x4c) != 0) {
          uVar8 = 1;
        }
        *(undefined4 *)(local_10 + 0x54) = uVar8;
        return *(FFSRecordType *)(local_10 + 0x54);
      }
    }
    p_Var6 = FFSTypeHandle_from_encode
                       ((FFSContext)in_stack_ffffffffffffff48,
                        (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    *(FFSTypeHandle_conflict *)(local_10 + 0x60) = p_Var6;
    if ((*(long *)(local_10 + 0x60) == 0) && (*(long *)(local_10 + 0xa0) != 0)) {
      local_40 = 0;
      iVar2 = (*ffs_file_lseek_func)(*(void **)(local_10 + 0x20),0,1);
      local_48 = (size_t)iVar2;
      local_4c = *(int *)(local_10 + 0x34);
      local_a4 = 0;
      memcpy(local_98,local_20,(long)local_4c);
      uVar1 = *(undefined8 *)(local_10 + 0x38);
      for (local_40 = *(long *)(local_10 + 0xa0);
          in_stack_ffffffffffffff37 = local_a4 == 0 && local_40 != 0, local_a4 == 0 && local_40 != 0
          ; local_40 = *(long *)(local_40 + 0x28)) {
        for (local_a8 = 0; local_a8 < *(int *)(local_40 + 0x1c); local_a8 = local_a8 + 1) {
          piVar7 = (int *)(*(long *)(local_40 + 0x20) + (long)local_a8 * 0x28);
          if ((((*piVar7 == 8) && (piVar7[6] == *(int *)(local_10 + 0x34))) &&
              (iVar2 = memcmp(*(void **)(piVar7 + 4),local_20,(long)*(int *)(local_10 + 0x34)),
              iVar2 == 0)) &&
             (iVar2 = (*ffs_file_lseek_func)(*(void **)(local_10 + 0x20),*(size_t *)(piVar7 + 2),0),
             iVar2 != -1)) {
            *(undefined4 *)(local_10 + 0x48) = 0;
            FFSread_format(in_stack_ffffffffffffff48);
            (*ffs_file_lseek_func)(*(void **)(local_10 + 0x20),local_48,0);
            *(undefined4 *)(local_10 + 0x48) = 1;
            *(undefined4 *)(local_10 + 0x54) = 4;
            local_20 = (void *)**(undefined8 **)(local_10 + 0x18);
            memcpy(local_20,local_98,(long)local_4c);
            *(undefined8 *)(local_10 + 0x38) = uVar1;
            p_Var6 = FFSTypeHandle_from_encode
                               ((FFSContext)in_stack_ffffffffffffff48,
                                (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ));
            *(FFSTypeHandle_conflict *)(local_10 + 0x60) = p_Var6;
            local_a4 = local_a4 + 1;
            break;
          }
        }
      }
    }
    p_Var6 = FFS_target_from_encode
                       ((FFSContext)in_stack_ffffffffffffff38,
                        (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    *(FFSTypeHandle_conflict *)(local_10 + 0x58) = p_Var6;
    if ((*(long *)(local_10 + 0x58) != 0) || (*(int *)(local_10 + 0x50) != 0)) {
      local_24 = FFSheader_size(*(FFSTypeHandle_conflict *)(local_10 + 0x60));
      if (*(int *)(local_10 + 0x34) < local_24) {
        iVar2 = local_24 - *(int *)(local_10 + 0x34);
        iVar4 = (**(code **)(local_10 + 0xc0))
                          (*(undefined8 *)(local_10 + 0x20),
                           (long)local_20 + (long)*(int *)(local_10 + 0x34),(long)iVar2,0);
        if (iVar4 != iVar2) {
          uVar8 = 2;
          if (*(int *)(local_10 + 0x4c) != 0) {
            uVar8 = 1;
          }
          *(undefined4 *)(local_10 + 0x54) = uVar8;
          return *(FFSRecordType *)(local_10 + 0x54);
        }
      }
      *(long *)(local_10 + 0x70) = *(long *)(local_10 + 0x70) + 1;
      break;
    }
    in_stack_ffffffffffffff48 =
         (FFSFile)(*(long *)(local_10 + 0x38) - (long)*(int *)(local_10 + 0x34));
    iVar2 = (**(code **)(local_10 + 0xc0))
                      (*(undefined8 *)(local_10 + 0x20),
                       (long)local_20 + (long)*(int *)(local_10 + 0x34),in_stack_ffffffffffffff48,0)
    ;
    if ((FFSFile)(long)iVar2 != in_stack_ffffffffffffff48) {
      uVar8 = 2;
      if (*(int *)(local_10 + 0x4c) != 0) {
        uVar8 = 1;
      }
      *(undefined4 *)(local_10 + 0x54) = uVar8;
      return *(FFSRecordType *)(local_10 + 0x54);
    }
    *(undefined4 *)(local_10 + 0x48) = 0;
    goto LAB_00121f5a;
  case (FFSFile)0x3:
    *(undefined4 *)(local_10 + 0x54) = 0x20;
    *(long *)(local_10 + 0x38) = (long)(int)(uVar3 & 0xffffff);
    break;
  default:
    printf("CORRUPT FFSFILE\n");
    exit(1);
  }
  *(undefined4 *)(local_10 + 0x48) = 1;
LAB_00122829:
  return *(FFSRecordType *)(local_10 + 0x54);
}

Assistant:

static
FFSRecordType
next_record_type(FFSFile ffsfile)
{
    FILE_INT indicator_chunk = 0;
 restart:
    if (ffsfile->status != OpenForRead) {
	return FFSerror;
    }
    if (ffsfile->tmp_buffer == NULL) {
	ffsfile->tmp_buffer = create_FFSBuffer();
    }
    if (ffsfile->read_ahead == FALSE) {
	if (!get_AtomicInt(ffsfile, &indicator_chunk)) {
	    ffsfile->next_record_type = 
		(ffsfile->errno_val) ? FFSerror : FFSend;
	    return ffsfile->next_record_type;
	}
	
	indicator_chunk = ntohl(indicator_chunk);
	switch (indicator_chunk >> 24) {
	case 0x1: /* comment */
		ffsfile->next_record_type = FFScomment;
		ffsfile->next_data_len = indicator_chunk & 0xffffff;
		break;
	case 0x2: /* format */
		ffsfile->next_record_type = FFSformat;
		ffsfile->next_fid_len = indicator_chunk & 0xffffff;
		if (!get_AtomicInt(ffsfile, &indicator_chunk)) {
		    ffsfile->next_record_type = (ffsfile->errno_val) ? FFSerror : FFSend;
		    return ffsfile->next_record_type;
		}
		ffsfile->next_data_len = ntohl(indicator_chunk);
		break;
	case 0x3: /* data */ {
		char *tmp_buf;
		int header_size;
		DATA_LEN_TYPE top_data_len_bytes;
		ffsfile->next_record_type = FFSdata;
		top_data_len_bytes = (indicator_chunk & 0xffff);
		if (!get_AtomicInt(ffsfile, &indicator_chunk)) {
		    ffsfile->next_record_type = (ffsfile->errno_val) ? FFSerror : FFSend;
		    return ffsfile->next_record_type;
		}
		ffsfile->next_data_len = ntohl(indicator_chunk) + 
		    (top_data_len_bytes << 32);
		make_tmp_buffer(ffsfile->tmp_buffer, ffsfile->next_data_len);
		tmp_buf = ffsfile->tmp_buffer->tmp_buffer;
		/* first get format ID, at least 8 bytes */
		if (ffsfile->read_func(ffsfile->file_id, tmp_buf, 8, NULL,
                                       NULL) != 8) {
		    ffsfile->next_record_type = (ffsfile->errno_val) ?
                        FFSerror : FFSend;
		    return ffsfile->next_record_type;
		}
		ffsfile->next_fid_len = FMformatID_len(tmp_buf);
		if (ffsfile->next_fid_len > 8) {
		    int more = ffsfile->next_fid_len - 8;
		    if (ffsfile->read_func(ffsfile->file_id, tmp_buf + 8,
                                           more, NULL, NULL) != more) {
			ffsfile->next_record_type = (ffsfile->errno_val) ?
                            FFSerror : FFSend;
			return ffsfile->next_record_type;
		    }
		}

		ffsfile->next_actual_handle = 
		    FFSTypeHandle_from_encode(ffsfile->c, tmp_buf);

                if (!ffsfile->next_actual_handle && ffsfile->index_head) {

                    struct _FFSIndexItem *index = NULL;
                    off_t fpos_bak = ffs_file_lseek_func(ffsfile->file_id, 0, SEEK_CUR);
		    int fid_len = ffsfile->next_fid_len;
		    char tmp_fid_storage[64];
		    size_t tmp_data_len;
		    int done = 0;
		    assert(sizeof(tmp_fid_storage) > fid_len);
		    /* store away the format ID we've read */
		    memcpy(tmp_fid_storage, tmp_buf, fid_len);
		    tmp_data_len = ffsfile->next_data_len;

                    index = ffsfile->index_head;
                    while (!done && index) {
			int i;
			for (i=0 ; i < index->elem_count; i++) {
			    struct _FFSIndexElement *elem;
			    elem = &index->elements[i];
			    if (elem->type == FFSformat &&
				elem->fid_len == ffsfile->next_fid_len &&
				!(memcmp(elem->format_id,
					 tmp_buf, ffsfile->next_fid_len))) {

				if (ffs_file_lseek_func(ffsfile->file_id, elem->fpos, SEEK_SET) != -1) {
				    ffsfile->read_ahead = FALSE;
				    FFSread_format(ffsfile);
				    ffs_file_lseek_func(ffsfile->file_id, fpos_bak, SEEK_SET);
				    ffsfile->read_ahead = TRUE;
				    ffsfile->next_record_type = FFSdata;
				    /* tmp_buf might have changed */
				    tmp_buf = ffsfile->tmp_buffer->tmp_buffer;
				    /* put back the format ID we read earlier */
				    memcpy(tmp_buf, tmp_fid_storage, fid_len);
				    ffsfile->next_data_len = tmp_data_len;

				    ffsfile->next_actual_handle = 
					FFSTypeHandle_from_encode(ffsfile->c,
								  tmp_buf);
				    done++;
				    break;
				}
			    }
                        }

                        index = index->next;
                    }
                }
		/* GSE
		 * If ffsfile->next_actual_handle is NULL here, we have 
		 * a problem.  The only way this should happen is if we 
		 * have used FFSset_fpos() to seek forward in a file, 
		 * skipping over the Format record associated with this
		 * data item.  But now we NEED IT.  We must :
		 *  1) Save our current FPOS
		 *  2) find the format in the index
		 *  3) lseek the its location (set read_ahead to false)
		 *  4) read the format
		 *  5) lseek back to our saved FPOS
		 *  6) call FFSTypeHandle_from_encode() again to set
		 *     next_actual_handle correctly.
		 */
		ffsfile->next_data_handle = 
		    FFS_target_from_encode(ffsfile->c, tmp_buf);

		if ((ffsfile->next_data_handle == NULL) &&
                    (!ffsfile->raw_flag)) {
		    /* no target for this format, discard */
		    size_t more = ffsfile->next_data_len - ffsfile->next_fid_len;
		    if (ffsfile->read_func(ffsfile->file_id, tmp_buf +
                                           ffsfile->next_fid_len, more, NULL,
                                           NULL) != more) {
			ffsfile->next_record_type = (ffsfile->errno_val) ?
                            FFSerror : FFSend;
			return ffsfile->next_record_type;
		    }
		    ffsfile->read_ahead = FALSE;
		    goto restart;
		    
		}
		header_size = FFSheader_size(ffsfile->next_actual_handle);
		if (header_size > ffsfile->next_fid_len) {
		    int more = header_size - ffsfile->next_fid_len;
		    if (ffsfile->read_func(ffsfile->file_id, tmp_buf +
                                           ffsfile->next_fid_len, more, NULL,
                                           NULL) != more) {
			ffsfile->next_record_type = (ffsfile->errno_val) ?
                            FFSerror : FFSend;
			return ffsfile->next_record_type;
		    }
		}
                ffsfile->data_block_no++;
		break;
	case 0x4: /* index */
		ffsfile->next_record_type = FFSindex;
		ffsfile->next_data_len = indicator_chunk & 0xffffff;
/*		if (!ffsfile->expose_index) {
		    ffs_file_lseek_func((int)(intptr_t)ffsfile->file_id, INDEX_BLOCK_SIZE-4, SEEK_CUR);
		    ffsfile->read_ahead = FALSE;
		    return next_record_type(ffsfile);
		    }*/
		break;
	default:
	    printf("CORRUPT FFSFILE\n");
	    exit(1);
	}
	}
	ffsfile->read_ahead = TRUE;
    }
    return ffsfile->next_record_type;
}